

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varlist.cc
# Opt level: O0

VariableStruct * __thiscall VariableList::LookupCpp(VariableList *this,string *VarName)

{
  bool bVar1;
  reference this_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
  local_38;
  undefined1 local_30 [16];
  reverse_iterator loop;
  VariableStruct *VarTable;
  string *VarName_local;
  VariableList *this_local;
  
  std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::rbegin
            ((vector<ListOfVariables,_std::allocator<ListOfVariables>_> *)(local_30 + 8));
  while( true ) {
    std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>::rend
              ((vector<ListOfVariables,_std::allocator<ListOfVariables>_> *)local_30);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
                             *)local_30);
    if (!bVar1) {
      return (VariableStruct *)(ListOfVariables *)loop.current._M_current;
    }
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
                           *)(local_30 + 8));
    loop.current._M_current =
         (__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>
          )ListOfVariables::LookupCpp(this_00,VarName);
    if (loop.current._M_current != (ListOfVariables *)0x0) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<ListOfVariables_*,_std::vector<ListOfVariables,_std::allocator<ListOfVariables>_>_>_>
    ::operator++(&local_38,(int)local_30 + 8);
  }
  return (VariableStruct *)loop.current._M_current;
}

Assistant:

VariableStruct *VariableList::LookupCpp
(
	const std::string &VarName	/**< Variable name to look up */
)
{
	VariableStruct *VarTable;

	for (reverse_iterator loop = rbegin();
		loop != rend(); loop++)
	{
		VarTable = (*loop).LookupCpp(VarName);

		if (VarTable != 0)
		{
			break;
		}
	}

	return VarTable;
}